

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GGMTree.cpp
# Opt level: O3

void GGMTree::derive_key_from_tree
               (uint8_t *current_key,long offset,int start_level,int target_level)

{
  int k_bit;
  uint8_t next_key [16];
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (target_level < start_level) {
    do {
      start_level = start_level + -1;
      local_4c = (undefined4)
                 ((1 << ((byte)start_level & 0x1f) & offset) >> ((byte)start_level & 0x3f));
      key_derivation((uchar *)&local_4c,4,current_key,0x10,(uchar *)&local_48);
      *(undefined8 *)current_key = local_48;
      *(undefined8 *)(current_key + 8) = uStack_40;
    } while (target_level < start_level);
  }
  return;
}

Assistant:

void GGMTree::derive_key_from_tree(uint8_t *current_key, long offset, int start_level, int target_level) {
    uint8_t next_key[AES_BLOCK_SIZE];
    // does not need to derive
    if(start_level == target_level) return;
    // derive tag
    for (int k = start_level; k > target_level; --k) {
        int k_bit = (offset & (1 << (k - 1))) >> (k - 1);
        key_derivation((uint8_t*) &k_bit, sizeof(int),
                       current_key, AES_BLOCK_SIZE,
                       next_key);
        memcpy(current_key, next_key, AES_BLOCK_SIZE);
    }
}